

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageInstanceImages::ImageInstanceImages
          (ImageInstanceImages *this,DeviceInterface *vki,VkDevice device,deUint32 queueFamilyIndex,
          VkQueue queue,Allocator *allocator,VkDescriptorType descriptorType,
          VkImageViewType viewType,int numImages,deUint32 baseMipLevel,deUint32 baseArraySlice)

{
  TextureLevelPyramid *this_00;
  VkImage VVar1;
  VkImageView VVar2;
  VkImageLayout layout;
  Move<vk::Handle<(vk::HandleType)13>_> local_c8;
  TextureLevelPyramid *local_a0;
  deUint32 local_94;
  Allocator *local_90;
  deUint64 local_88;
  DeviceInterface *pDStack_80;
  VkDevice local_78;
  VkAllocationCallbacks *pVStack_70;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_68;
  Move<vk::Handle<(vk::HandleType)13>_> *local_60;
  Move<vk::Handle<(vk::HandleType)9>_> *local_58;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_50;
  Move<vk::Handle<(vk::HandleType)13>_> *local_48;
  Move<vk::Handle<(vk::HandleType)9>_> *local_40;
  VkQueue local_38;
  
  this->m_viewType = viewType;
  this->m_baseMipLevel = baseMipLevel;
  this->m_baseArraySlice = baseArraySlice;
  (this->m_imageFormat).order = RGBA;
  (this->m_imageFormat).type = UNORM_INT8;
  this_00 = &this->m_sourceImageA;
  local_94 = queueFamilyIndex;
  local_90 = allocator;
  local_38 = queue;
  tcu::TextureLevelPyramid::TextureLevelPyramid(this_00,&this->m_imageFormat,2);
  local_a0 = &this->m_sourceImageB;
  tcu::TextureLevelPyramid::TextureLevelPyramid(local_a0,&this->m_imageFormat,2);
  local_50 = &this->m_imageMemoryA;
  (this->m_imageMemoryA).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  local_68 = &this->m_imageMemoryB;
  (this->m_imageMemoryB).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  local_40 = &this->m_imageA;
  local_58 = &this->m_imageB;
  local_48 = &this->m_imageViewA;
  local_60 = &this->m_imageViewB;
  (this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_imageViewA).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  (this->m_imageViewA).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageViewA).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_imageViewA).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_imageViewB).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  (this->m_imageViewB).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageViewB).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_imageViewB).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  populateSourceImage(this,this_00,true);
  createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&local_c8,vki,device,local_90,descriptorType,
              viewType,this_00,local_50);
  local_78 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pVStack_70 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_88 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  pDStack_80 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar1.m_internal =
       (local_40->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  if (VVar1.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,VVar1)
    ;
  }
  (local_40->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_device = local_78;
  (local_40->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_allocator = pVStack_70;
  (local_40->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal = local_88;
  (local_40->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_deviceIface =
       pDStack_80;
  if (local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)
               &local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkImage)local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                        m_internal);
  }
  createImageView(&local_c8,vki,device,viewType,this_00,
                  (VkImage)(this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                           object.m_internal,this->m_baseMipLevel,this->m_baseArraySlice);
  local_78 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pVStack_70 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_88 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  pDStack_80 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar2.m_internal =
       (local_48->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  if (VVar2.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_imageViewA).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               VVar2);
  }
  (local_48->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device = local_78;
  (local_48->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator = pVStack_70
  ;
  (local_48->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = local_88;
  (local_48->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
       pDStack_80;
  if (local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkImageView)
               local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
  }
  layout = (uint)(descriptorType != VK_DESCRIPTOR_TYPE_STORAGE_IMAGE) * 4 + VK_IMAGE_LAYOUT_GENERAL;
  uploadImage(this,vki,device,local_94,local_38,local_90,
              (VkImage)(this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                       m_internal,layout,this_00);
  if (numImages == 2) {
    populateSourceImage(this,local_a0,false);
    createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&local_c8,vki,device,local_90,descriptorType
                ,viewType,local_a0,local_68);
    local_78 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
    pVStack_70 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
    local_88 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    pDStack_80 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                 m_deviceIface;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    VVar1.m_internal =
         (local_58->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
    if (VVar1.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                (&(this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
                 VVar1);
    }
    (local_58->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_device = local_78;
    (local_58->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_allocator =
         pVStack_70;
    (local_58->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal = local_88;
    (local_58->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_deviceIface =
         pDStack_80;
    if (local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)9>_> *)
                 &local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkImage)local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                          m_internal);
    }
    createImageView(&local_c8,vki,device,viewType,local_a0,
                    (VkImage)(this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                             object.m_internal,this->m_baseMipLevel,this->m_baseArraySlice);
    local_78 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
    pVStack_70 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
    local_88 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    pDStack_80 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                 m_deviceIface;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    VVar2.m_internal =
         (local_60->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
    if (VVar2.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&(this->m_imageViewB).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter
                 ,VVar2);
    }
    (local_60->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device = local_78;
    (local_60->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
         pVStack_70;
    (local_60->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = local_88;
    (local_60->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
         pDStack_80;
    if (local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkImageView)
                 local_c8.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
    uploadImage(this,vki,device,local_94,local_38,local_90,
                (VkImage)(this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                         object.m_internal,layout,local_a0);
  }
  return;
}

Assistant:

ImageInstanceImages::ImageInstanceImages (const vk::DeviceInterface&	vki,
										  vk::VkDevice					device,
										  deUint32						queueFamilyIndex,
										  vk::VkQueue					queue,
										  vk::Allocator&				allocator,
										  vk::VkDescriptorType			descriptorType,
										  vk::VkImageViewType			viewType,
										  int							numImages,
										  deUint32						baseMipLevel,
										  deUint32						baseArraySlice)
	: m_viewType		(viewType)
	, m_baseMipLevel	(baseMipLevel)
	, m_baseArraySlice	(baseArraySlice)
	, m_imageFormat		(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)
	, m_sourceImageA	(m_imageFormat, NUM_MIP_LEVELS)
	, m_sourceImageB	(m_imageFormat, NUM_MIP_LEVELS)
	, m_imageMemoryA	(DE_NULL)
	, m_imageMemoryB	(DE_NULL)
	, m_imageA			(vk::Move<vk::VkImage>())
	, m_imageB			(vk::Move<vk::VkImage>())
	, m_imageViewA		(vk::Move<vk::VkImageView>())
	, m_imageViewB		(vk::Move<vk::VkImageView>())
{
	const vk::VkImageLayout	layout	= getImageLayoutForDescriptorType(descriptorType);

	DE_ASSERT(numImages == 1 || numImages == 2);

	populateSourceImage(&m_sourceImageA, true);
	m_imageA = createImage(vki, device, allocator, descriptorType, viewType, m_sourceImageA, &m_imageMemoryA);
	m_imageViewA = createImageView(vki, device, viewType, m_sourceImageA, *m_imageA, m_baseMipLevel, m_baseArraySlice);
	uploadImage(vki, device, queueFamilyIndex, queue, allocator, *m_imageA, layout, m_sourceImageA);

	if (numImages == 2)
	{
		populateSourceImage(&m_sourceImageB, false);
		m_imageB = createImage(vki, device, allocator, descriptorType, viewType, m_sourceImageB, &m_imageMemoryB);
		m_imageViewB = createImageView(vki, device, viewType, m_sourceImageB, *m_imageB, m_baseMipLevel, m_baseArraySlice);
		uploadImage(vki, device, queueFamilyIndex, queue, allocator, *m_imageB, layout, m_sourceImageB);
	}
}